

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  lua_Number n;
  Instruction *pIVar1;
  int iVar2;
  Instruction i;
  long local_20;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
    i = reg << 7 | 7;
    goto LAB_0010e04a;
  case VFALSE:
    i = reg << 7 | 5;
LAB_0010e04a:
    luaK_code(fs,i);
    break;
  case VK:
    goto switchD_0010dfe5_caseD_4;
  case VKFLT:
    n = (e->u).nval;
    iVar2 = luaV_flttointeger(n,&local_20,F2Ieq);
    if ((iVar2 != 0) && (0xfffffffffffdffff < local_20 - 0x10001U)) {
      codeAsBx(fs,OP_LOADF,reg,(int)local_20);
      break;
    }
    iVar2 = luaK_numberK(fs,n);
    goto LAB_0010e096;
  case VKINT:
    luaK_int(fs,reg,(e->u).ival);
    break;
  case VKSTR:
    str2K(fs,e);
    goto switchD_0010dfe5_caseD_4;
  case VNONRELOC:
    if ((e->u).info != reg) {
      i = (e->u).info << 0x10 | reg << 7;
      goto LAB_0010e04a;
    }
    break;
  default:
    goto switchD_0010dfe5_caseD_9;
  case VRELOC:
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = (reg & 0xffU) << 7 | pIVar1[(e->u).info] & 0xffff807f;
  }
LAB_0010e0cb:
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_0010dfe5_caseD_9:
  return;
switchD_0010dfe5_caseD_4:
  iVar2 = (e->u).info;
LAB_0010e096:
  luaK_codek(fs,reg,iVar2);
  goto LAB_0010e0cb;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: {
      luaK_codeABC(fs, OP_LOADFALSE, reg, 0, 0);
      break;
    }
    case VTRUE: {
      luaK_codeABC(fs, OP_LOADTRUE, reg, 0, 0);
      break;
    }
    case VKSTR: {
      str2K(fs, e);
    }  /* FALLTHROUGH */
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_float(fs, reg, e->u.nval);
      break;
    }
    case VKINT: {
      luaK_int(fs, reg, e->u.ival);
      break;
    }
    case VRELOC: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info)
        luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}